

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O2

Scalar __thiscall
Eigen::
DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<float,-1,-1,0,-1,-1>,-1,1,true>,-1,1,false>const,-1,1,false>const>>
::redux<Eigen::internal::scalar_sum_op<float,float>>
          (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,1,true>,_1,1,false>const,_1,1,false>const>>
           *this,scalar_sum_op<float,_float> *func)

{
  Scalar SVar1;
  ThisEvaluator thisEval;
  redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false>_>_>
  local_20;
  
  if (0 < *(long *)(this + 8)) {
    local_20.
    super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false>_>_>
    .
    super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false>_>,_Eigen::internal::IndexBased,_float>
    .m_d.argImpl.
    super_evaluator<Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false>_>
    .
    super_block_evaluator<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false,_true>
    .
    super_mapbase_evaluator<Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
    .m_data = *(PointerType *)this;
    local_20.
    super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false>_>_>
    .
    super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false>_>,_Eigen::internal::IndexBased,_float>
    .m_d.argImpl.
    super_evaluator<Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false>_>
    .
    super_block_evaluator<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false,_true>
    .
    super_mapbase_evaluator<Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
    .m_outerStride.m_value = *(long *)(*(long *)(this + 0x48) + 8);
    SVar1 = internal::
            redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<float,-1,-1,0,-1,-1>,-1,1,true>,-1,1,false>const,-1,1,false>const>>,3,0>
            ::
            run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,1,true>,_1,1,false>const,_1,1,false>const>>
                      (&local_20,func,
                       (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false>_>
                        *)this);
    return SVar1;
  }
  __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Redux.h"
                ,0x19b,
                "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>, const Eigen::Block<const Eigen::Block<Eigen::Block<Eigen::Matrix<float, -1, -1>, -1, 1, true>, -1, 1>, -1, 1>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>, const Eigen::Block<const Eigen::Block<Eigen::Block<Eigen::Matrix<float, -1, -1>, -1, 1, true>, -1, 1>, -1, 1>>, BinaryOp = Eigen::internal::scalar_sum_op<float>]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE typename internal::traits<Derived>::Scalar
DenseBase<Derived>::redux(const Func& func) const
{
  eigen_assert(this->rows()>0 && this->cols()>0 && "you are using an empty matrix");

  typedef typename internal::redux_evaluator<Derived> ThisEvaluator;
  ThisEvaluator thisEval(derived());

  // The initial expression is passed to the reducer as an additional argument instead of
  // passing it as a member of redux_evaluator to help  
  return internal::redux_impl<Func, ThisEvaluator>::run(thisEval, func, derived());
}